

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::sendInWorker(TCPSocket *this)

{
  mutex *__mutex;
  linklist *plVar1;
  size_t sVar2;
  sendContext *psVar3;
  linklist *plVar4;
  Poller *this_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  sendContext *psVar8;
  ssize_t sVar9;
  int *piVar10;
  rep rVar11;
  size_t *psVar12;
  _Manager_operation extraout_EDX;
  ulong uVar13;
  int iVar14;
  sendContext *c;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  undefined1 auStack_d8 [8];
  FlushCallback flushCallback;
  ErrorCallback errorCallback;
  HighWaterCallback highWaterCallback;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  linklist *local_50;
  _Any_data local_48;
  uint local_34;
  
  flushCallback.super__Function_base._M_functor._8_8_ = 0;
  flushCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  flushCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  errorCallback.super__Function_base._M_functor._8_8_ = 0;
  errorCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  flushCallback._M_invoker = (_Invoker_type)0x0;
  errorCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  errorCallback._M_invoker = (_Invoker_type)0x0;
  __mutex = &this->mtx;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  bVar5 = canWrite(this);
  if (!bVar5) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    goto LAB_0011755c;
  }
  if ((this->writeable == false) &&
     (this->highWaterSize < this->bytes4Send && this->highWaterSize != 0)) {
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)> *)
               &errorCallback._M_invoker,&this->highWaterCallback_);
    iVar14 = 1;
    bVar5 = false;
    local_34 = 0;
  }
  else {
    plVar1 = this->ptrSendlist;
    iVar6 = this->writeableVer;
    bVar5 = this->slistIdx == 0;
    this->slistIdx = (uint)bVar5;
    this->ptrSendlist = this->sendLists + bVar5;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    psVar8 = plVar1->head;
    bVar5 = psVar8 == (sendContext *)0x0;
    if (bVar5) {
      uVar15 = 0;
      local_34 = CONCAT31(local_34._1_3_,1);
      iVar14 = 0;
    }
    else {
      psVar12 = &this->send_iovec[0].iov_len;
      iVar14 = 0;
      uVar13 = 0;
      do {
        sVar2 = psVar8->len;
        *psVar12 = sVar2;
        ((iovec *)(psVar12 + -1))->iov_base = psVar8->ptr;
        iVar14 = (int)sVar2 + iVar14;
        uVar15 = uVar13 + 1;
        psVar8 = psVar8->next;
        bVar5 = psVar8 == (sendContext *)0x0;
        if (bVar5) break;
        psVar12 = psVar12 + 2;
        bVar18 = uVar13 < 0x7f;
        uVar13 = uVar15;
      } while (bVar18);
      local_34 = CONCAT31(local_34._1_3_,psVar8 == (sendContext *)0x0);
    }
    local_50 = plVar1;
    do {
      sVar9 = writev(this->fd,(iovec *)this->send_iovec,(int)uVar15);
      if (sVar9 != -1) break;
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    uVar17 = (uint)sVar9;
    if (((char)local_34 == '\x01' && iVar14 <= (int)uVar17) &&
       (psVar8 = local_50->head, psVar8 != (sendContext *)0x0)) {
      do {
        psVar3 = psVar8->next;
        sendContextPool::put((sendContextPool *)sContextPool,psVar8);
        psVar8 = psVar3;
      } while (psVar3 != (sendContext *)0x0);
      local_50->head = (sendContext *)0x0;
      local_50->tail = (sendContext *)0x0;
    }
    plVar1 = local_50;
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    local_34 = (uint)this->closedOnFlush;
    if ((int)uVar17 < 0) {
      piVar10 = __errno_location();
      if (*piVar10 == 0xb) {
        psVar8 = plVar1->head;
        if (psVar8 != (sendContext *)0x0) {
          plVar4 = this->ptrSendlist;
          if (plVar4->head == (sendContext *)0x0) {
            plVar4->head = psVar8;
            plVar4->tail = plVar1->tail;
          }
          else {
            plVar1->tail->next = plVar4->head;
            plVar4->head = psVar8;
          }
          plVar1->head = (sendContext *)0x0;
          plVar1->tail = (sendContext *)0x0;
        }
        iVar14 = 0;
        if (this->writeableVer == iVar6) {
          this->writeable = false;
          bVar5 = true;
        }
        else {
LAB_001178fc:
          bVar5 = false;
        }
      }
      else {
        bVar5 = false;
        iVar14 = 0;
        if (((this->closed)._M_base._M_i & 1U) == 0) {
          std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                    ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                     &flushCallback._M_invoker,&this->errorCallback_);
          this->socketError = true;
          this->err = *piVar10;
          iVar14 = 3;
          goto LAB_001178fc;
        }
      }
    }
    else {
      if (this->sendTimeout != 0) {
        rVar11 = std::chrono::_V2::steady_clock::now();
        (this->lastSendTime).__d.__r = rVar11;
      }
      if ((uVar17 != 0) && (!bVar5 || (int)uVar17 < iVar14)) {
        uVar15 = (ulong)(uVar17 & 0x7fffffff);
        do {
          psVar8 = local_50->head;
          uVar13 = psVar8->len;
          uVar16 = uVar15 - uVar13;
          if (uVar15 < uVar13) {
            psVar8->ptr = psVar8->ptr + uVar15;
            psVar8->len = uVar13 - uVar15;
            uVar16 = uVar15;
          }
          else if (psVar8 != (sendContext *)0x0) {
            psVar3 = psVar8->next;
            local_50->head = psVar3;
            if (psVar3 == (sendContext *)0x0) {
              local_50->tail = (sendContext *)0x0;
            }
            sendContextPool::put((sendContextPool *)sContextPool,psVar8);
          }
          bVar5 = uVar13 <= uVar15;
          uVar15 = uVar16;
        } while (bVar5);
        psVar8 = local_50->head;
        if (psVar8 != (sendContext *)0x0) {
          plVar1 = this->ptrSendlist;
          if (plVar1->head == (sendContext *)0x0) {
            plVar1->head = psVar8;
            plVar1->tail = local_50->tail;
          }
          else {
            local_50->tail->next = plVar1->head;
            plVar1->head = psVar8;
          }
          local_50->head = (sendContext *)0x0;
          local_50->tail = (sendContext *)0x0;
        }
      }
      this->bytes4Send = this->bytes4Send - (ulong)(uVar17 & 0x7fffffff);
      bVar5 = false;
      iVar14 = 0;
      if (this->ptrSendlist->head == (sendContext *)0x0) {
        if (this->shutdown == true) {
          shutdown(this->fd,1);
        }
        if ((this->flushCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                    ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)auStack_d8,
                     &this->flushCallback_);
          iVar14 = 2;
          goto LAB_001178fc;
        }
        bVar5 = false;
        iVar14 = 0;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar5) {
    this_00 = this->poller_;
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    local_48._M_unused._0_8_ = (undefined8)(local_60 + 8);
    if (local_60 == 0) {
      local_48._M_unused._M_object = (void *)0x0;
    }
    local_48._8_8_ = p_Stack_58;
    local_60 = 0;
    p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Poller::Enable(this_00,(Ptr *)&local_48,4);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
    }
  }
  if (iVar14 == 3) {
    if (errorCallback.super__Function_base._M_functor._8_8_ != 0) {
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)local_48._M_pod_data,
                 (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPSocket>);
      local_60 = CONCAT44(local_60._4_4_,this->err);
      if (errorCallback.super__Function_base._M_functor._8_8_ == 0) {
        std::__throw_bad_function_call();
      }
      (*errorCallback.super__Function_base._M_manager)
                ((_Any_data *)&flushCallback._M_invoker,&local_48,(_Manager_operation)&local_60);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
      }
      goto LAB_0011755c;
    }
  }
  else {
    if (iVar14 != 2) goto LAB_0011755c;
    if (flushCallback.super__Function_base._M_functor._8_8_ != 0) {
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)local_48._M_pod_data,
                 (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPSocket>);
      if (flushCallback.super__Function_base._M_functor._8_8_ == 0) {
        std::__throw_bad_function_call();
      }
      (*flushCallback.super__Function_base._M_manager)
                ((_Any_data *)auStack_d8,&local_48,extraout_EDX);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
      }
    }
    if ((char)local_34 == '\0') goto LAB_0011755c;
  }
  Close(this);
LAB_0011755c:
  if (errorCallback.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)errorCallback.super__Function_base._M_functor._8_8_)
              (&flushCallback._M_invoker,&flushCallback._M_invoker,3);
  }
  if (flushCallback.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)flushCallback.super__Function_base._M_functor._8_8_)(auStack_d8,auStack_d8,3);
  }
  return;
}

Assistant:

void TCPSocket::sendInWorker() {
	
	auto cb = nothing;

	FlushCallback flushCallback = nullptr;
	ErrorCallback errorCallback = nullptr;
	HighWaterCallback highWaterCallback = nullptr;
	size_t bytes4Send_ = 0;
	auto closedOnFlush_ = false;
	auto enableWrite = false;//是否需要调用Enable(Write)


	this->mtx.lock();

	
	if(!this->canWrite()){
		this->mtx.unlock();
		return; 
	} else {
		if(!this->writeable && this->highWater()) {
			cb = callHighwaterCallback;
			bytes4Send_ = this->bytes4Send;
			highWaterCallback = this->highWaterCallback_;
		} else {
			auto localSendlist = this->ptrSendlist;
			auto localVer = this->writeableVer;
			this->slistIdx = this->slistIdx == 0 ? 1 : 0;
			this->ptrSendlist = &this->sendLists[this->slistIdx]; 

			this->mtx.unlock();

			auto c   = 0;
			auto totalBytes = 0;
			auto cur =  localSendlist->head;
			for( ; cur != nullptr && c < max_send_iovec_size; cur = cur->next,++c) {
				send_iovec[c].iov_len = cur->len;
				send_iovec[c].iov_base = cur->ptr;
				totalBytes += cur->len;			
			}

			int n = TEMP_FAILURE_RETRY(::writev(this->fd,&this->send_iovec[0],c));

			if(n >= totalBytes && cur == nullptr){
				localSendlist->clear();
			}

			this->mtx.lock();

			closedOnFlush_ = this->closedOnFlush;

			if(n >= 0) {

				if(this->sendTimeout > 0) {
					this->lastSendTime = std::chrono::steady_clock::now();
				}

				if(n > 0 && (n < totalBytes || cur != nullptr)) {
					//部分发送
					size_t nn = (size_t)n;
					for( ; ; ) {
						auto front = localSendlist->front();
						if(nn >= front->len) {
							nn -= front->len;
							localSendlist->pop_front();
						} else {
							front->ptr += nn;
							front->len -= nn;
							break;
						}
					}
					this->ptrSendlist->add_front(localSendlist);
				}

				this->bytes4Send -= n;
				if(this->ptrSendlist->empty()){
					if(this->shutdown){
						::shutdown(this->fd,SHUT_WR);
					}
					if(this->flushCallback_) {
						flushCallback = this->flushCallback_;
						cb = callFlushCallback;
					}
				}

			} else {
				if(n < 0 && errno == EAGAIN) {
					this->ptrSendlist->add_front(localSendlist);
					if(this->writeableVer == localVer) {
						this->writeable = false;
						enableWrite = true;				
					}
				} else {
					if(!this->closed){
						errorCallback = this->errorCallback_;
						this->socketError = true;
						this->err = errno;
						cb = callErrorCallback;
					}
				}
			}
		}
	}


	this->mtx.unlock();

	if(enableWrite) {
		this->poller_->Enable(shared_from_this(),Poller::Write);
	}

	switch(cb){
		case callHighwaterCallback:{
			if(highWaterCallback){
				highWaterCallback(shared_from_this(),bytes4Send_);
			}			
		}
		break;
		case callFlushCallback:{
			if(flushCallback){
				flushCallback(shared_from_this());
			}
			if(closedOnFlush_){
				this->Close();
			}			
		}
		break;
		case callErrorCallback:{
			if(errorCallback) {
				errorCallback(shared_from_this(),err);
			} else {
				this->Close();
			}				
		}
		break;
		default:{
			return;
		}
	}
}